

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VMContext.cpp
# Opt level: O3

void __thiscall
Lodtalk::VMContext::executeScript(VMContext *this,string *code,string *name,string *basePath)

{
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(string **)local_48._M_unused._0_8_ = code;
  *(string **)((long)local_48._M_unused._0_8_ + 8) = name;
  *(string **)((long)local_48._M_unused._0_8_ + 0x10) = basePath;
  local_30 = std::
             _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/VMContext.cpp:41:21)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/VMContext.cpp:41:21)>
             ::_M_manager;
  withInterpreter(this,(WithInterpreterBlock *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void VMContext::executeScript(const std::string &code, const std::string &name, const std::string &basePath)
{
    withInterpreter([&](InterpreterProxy *interpreter) {
        Lodtalk::executeScript(interpreter, code, name, basePath);
    });
}